

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O1

void __thiscall
FrobTadsApplicationCurses::FrobTadsApplicationCurses
          (FrobTadsApplicationCurses *this,FrobOptions *opts)

{
  bool bVar1;
  char cVar2;
  pointer *__ptr;
  uint bogusY;
  uint bogusX;
  uint local_20;
  uint local_1c;
  
  FrobTadsApplication::FrobTadsApplication(&this->super_FrobTadsApplication,opts);
  (this->super_FrobTadsApplication)._vptr_FrobTadsApplication = (_func_int **)&PTR_init_00350870;
  (this->fGameWindow)._M_t.
  super___uniq_ptr_impl<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>._M_t.
  super__Tuple_impl<0UL,_FrobTadsWindow_*,_std::default_delete<FrobTadsWindow>_>.
  super__Head_base<0UL,_FrobTadsWindow_*,_false>._M_head_impl = (FrobTadsWindow *)0x0;
  (this->fDispBuf)._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x0;
  bVar1 = getTermSize(&local_1c,&local_20);
  if (bVar1) {
    putenv(FrobTadsApplicationCurses::lines);
    putenv(FrobTadsApplicationCurses::columns);
  }
  initscr();
  cbreak();
  noecho();
  curs_set(0);
  nonl();
  if (((opts->useColors != true) || (cVar2 = has_colors(), cVar2 == '\0')) &&
     (opts->forceColors != true)) {
    return;
  }
  (this->super_FrobTadsApplication).fColorsEnabled = true;
  start_color();
  if (opts->defColors == true) {
    use_default_colors();
  }
  init_pair(7,0,0);
  init_pair(1,1,0);
  init_pair(2,2,0);
  init_pair(3,3,0);
  init_pair(4,4,0);
  init_pair(5,5,0);
  init_pair(6,6,0);
  init_pair(8,0,1);
  init_pair(9,1,1);
  init_pair(10,2,1);
  init_pair(0xb,3,1);
  init_pair(0xc,4,1);
  init_pair(0xd,5,1);
  init_pair(0xe,6,1);
  init_pair(0xf,7,1);
  init_pair(0x10,0,2);
  init_pair(0x11,1,2);
  init_pair(0x12,2,2);
  init_pair(0x13,3,2);
  init_pair(0x14,4,2);
  init_pair(0x15,5,2);
  init_pair(0x16,6,2);
  init_pair(0x17,7,2);
  init_pair(0x18,0,3);
  init_pair(0x19,1,3);
  init_pair(0x1a,2,3);
  init_pair(0x1b,3,3);
  init_pair(0x1c,4,3);
  init_pair(0x1d,5,3);
  init_pair(0x1e,6,3);
  init_pair(0x1f,7,3);
  init_pair(0x20,0,4);
  init_pair(0x21,1,4);
  init_pair(0x22,2,4);
  init_pair(0x23,3,4);
  init_pair(0x24,4,4);
  init_pair(0x25,5,4);
  init_pair(0x26,6,4);
  init_pair(0x27,7,4);
  init_pair(0x28,0,5);
  init_pair(0x29,1,5);
  init_pair(0x2a,2,5);
  init_pair(0x2b,3,5);
  init_pair(0x2c,4,5);
  init_pair(0x2d,5,5);
  init_pair(0x2e,6,5);
  init_pair(0x2f,7,5);
  init_pair(0x30,0,6);
  init_pair(0x31,1,6);
  init_pair(0x32,2,6);
  init_pair(0x33,3,6);
  init_pair(0x34,4,6);
  init_pair(0x35,5,6);
  init_pair(0x36,6,6);
  init_pair(0x37,7,6);
  init_pair(0x38,0,7);
  init_pair(0x39,1,7);
  init_pair(0x3a,2,7);
  init_pair(0x3b,3,7);
  init_pair(0x3c,4,7);
  init_pair(0x3d,5,7);
  init_pair(0x3e,6,7);
  init_pair(0x3f,7,7);
  return;
}

Assistant:

FrobTadsApplicationCurses::FrobTadsApplicationCurses( const FrobOptions& opts )
    : FrobTadsApplication(opts)
{
    // Before starting curses, we set the LINES and COLUMNS env.
    // variables to a "maximum" value.  This is needed in case we're
    // running on a system with an old/broken curses implementation
    // (Solaris curses, for example).  This forces curses to
    // allocate enough internal memory for the windows in case the
    // terminal gets resized.  Note that we only do this if
    // detection of the terminal size is possible at all.
#if HAVE_PUTENV
    unsigned bogusX, bogusY; // Dummies.
    if (getTermSize(bogusX, bogusY)) {
        // The strings become part of the environment; they have to be
        // static.
        static char lines[] = "LINES=225";
        static char columns[] = "COLUMNS=300";
        putenv(lines);
        putenv(columns);
    }
#endif

    // Fire-up curses.
    initscr();

    // Make characters typed by the user immediately available to
    // the program.
    cbreak();

    // Tell courses not to echo user-input (TADS does the echoing).
    noecho();

    // Hide the cursor.  This avoids the "crazy cursor jumping"
    // problem on *really* slow terminals, as TADS constantly moves
    // the cursor all over the place.
    curs_set(0);

    // Tell courses not to try to translate the RETURN/ENTER key on
    // input (or else getch() and friends would never report that
    // key), and the '\n' character on output (since the osgen layer
    // handles newlines).
    nonl();

    // Initialize colors if we want color support and the terminal supports it.
    if ((opts.useColors and has_colors()) or opts.forceColors) {
        this->fColorsEnabled = true;
        start_color();
        // Assign terminal default foreground/background colors
        // to color number -1 / color pair 0.
#if HAVE_USE_DEFAULT_COLORS
        if (opts.defColors) {
            use_default_colors();
        }
#endif
        // Initialize the curses color-pairs we use.
        //
        // This is paranoia, but better to make sure that curses
        // will use the right colors.  The paranoid part of this
        // is that we assume that there might be some curses
        // version out there that does not use monotonically
        // increasing values for the COLOR_* symbols.
        init_pair(makeColorPair(FROB_BLACK,   FROB_BLACK), COLOR_BLACK,   COLOR_BLACK);
        init_pair(makeColorPair(FROB_RED,     FROB_BLACK), COLOR_RED,     COLOR_BLACK);
        init_pair(makeColorPair(FROB_GREEN,   FROB_BLACK), COLOR_GREEN,   COLOR_BLACK);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_BLACK), COLOR_YELLOW,  COLOR_BLACK);
        init_pair(makeColorPair(FROB_BLUE,    FROB_BLACK), COLOR_BLUE,    COLOR_BLACK);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_BLACK), COLOR_MAGENTA, COLOR_BLACK);
        init_pair(makeColorPair(FROB_CYAN,    FROB_BLACK), COLOR_CYAN,    COLOR_BLACK);
        // White on black is wired to color pair 0 by
        // definition; we can't and don't need to initialize it.
        //init_pair(makeColorPair(FROB_WHITE,   FROB_BLACK), COLOR_WHITE,   COLOR_BLACK);

        init_pair(makeColorPair(FROB_BLACK,   FROB_RED), COLOR_BLACK,   COLOR_RED);
        init_pair(makeColorPair(FROB_RED,     FROB_RED), COLOR_RED,     COLOR_RED);
        init_pair(makeColorPair(FROB_GREEN,   FROB_RED), COLOR_GREEN,   COLOR_RED);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_RED), COLOR_YELLOW,  COLOR_RED);
        init_pair(makeColorPair(FROB_BLUE,    FROB_RED), COLOR_BLUE,    COLOR_RED);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_RED), COLOR_MAGENTA, COLOR_RED);
        init_pair(makeColorPair(FROB_CYAN,    FROB_RED), COLOR_CYAN,    COLOR_RED);
        init_pair(makeColorPair(FROB_WHITE,   FROB_RED), COLOR_WHITE,   COLOR_RED);

        init_pair(makeColorPair(FROB_BLACK,   FROB_GREEN), COLOR_BLACK,   COLOR_GREEN);
        init_pair(makeColorPair(FROB_RED,     FROB_GREEN), COLOR_RED,     COLOR_GREEN);
        init_pair(makeColorPair(FROB_GREEN,   FROB_GREEN), COLOR_GREEN,   COLOR_GREEN);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_GREEN), COLOR_YELLOW,  COLOR_GREEN);
        init_pair(makeColorPair(FROB_BLUE,    FROB_GREEN), COLOR_BLUE,    COLOR_GREEN);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_GREEN), COLOR_MAGENTA, COLOR_GREEN);
        init_pair(makeColorPair(FROB_CYAN,    FROB_GREEN), COLOR_CYAN,    COLOR_GREEN);
        init_pair(makeColorPair(FROB_WHITE,   FROB_GREEN), COLOR_WHITE,   COLOR_GREEN);

        init_pair(makeColorPair(FROB_BLACK,   FROB_YELLOW), COLOR_BLACK,   COLOR_YELLOW);
        init_pair(makeColorPair(FROB_RED,     FROB_YELLOW), COLOR_RED,     COLOR_YELLOW);
        init_pair(makeColorPair(FROB_GREEN,   FROB_YELLOW), COLOR_GREEN,   COLOR_YELLOW);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_YELLOW), COLOR_YELLOW,  COLOR_YELLOW);
        init_pair(makeColorPair(FROB_BLUE,    FROB_YELLOW), COLOR_BLUE,    COLOR_YELLOW);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_YELLOW), COLOR_MAGENTA, COLOR_YELLOW);
        init_pair(makeColorPair(FROB_CYAN,    FROB_YELLOW), COLOR_CYAN,    COLOR_YELLOW);
        init_pair(makeColorPair(FROB_WHITE,   FROB_YELLOW), COLOR_WHITE,   COLOR_YELLOW);

        init_pair(makeColorPair(FROB_BLACK,   FROB_BLUE), COLOR_BLACK,   COLOR_BLUE);
        init_pair(makeColorPair(FROB_RED,     FROB_BLUE), COLOR_RED,     COLOR_BLUE);
        init_pair(makeColorPair(FROB_GREEN,   FROB_BLUE), COLOR_GREEN,   COLOR_BLUE);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_BLUE), COLOR_YELLOW,  COLOR_BLUE);
        init_pair(makeColorPair(FROB_BLUE,    FROB_BLUE), COLOR_BLUE,    COLOR_BLUE);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_BLUE), COLOR_MAGENTA, COLOR_BLUE);
        init_pair(makeColorPair(FROB_CYAN,    FROB_BLUE), COLOR_CYAN,    COLOR_BLUE);
        init_pair(makeColorPair(FROB_WHITE,   FROB_BLUE), COLOR_WHITE,   COLOR_BLUE);

        init_pair(makeColorPair(FROB_BLACK,   FROB_MAGENTA), COLOR_BLACK,   COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_RED,     FROB_MAGENTA), COLOR_RED,     COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_GREEN,   FROB_MAGENTA), COLOR_GREEN,   COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_MAGENTA), COLOR_YELLOW,  COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_BLUE,    FROB_MAGENTA), COLOR_BLUE,    COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_MAGENTA), COLOR_MAGENTA, COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_CYAN,    FROB_MAGENTA), COLOR_CYAN,    COLOR_MAGENTA);
        init_pair(makeColorPair(FROB_WHITE,   FROB_MAGENTA), COLOR_WHITE,   COLOR_MAGENTA);

        init_pair(makeColorPair(FROB_BLACK,   FROB_CYAN), COLOR_BLACK,   COLOR_CYAN);
        init_pair(makeColorPair(FROB_RED,     FROB_CYAN), COLOR_RED,     COLOR_CYAN);
        init_pair(makeColorPair(FROB_GREEN,   FROB_CYAN), COLOR_GREEN,   COLOR_CYAN);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_CYAN), COLOR_YELLOW,  COLOR_CYAN);
        init_pair(makeColorPair(FROB_BLUE,    FROB_CYAN), COLOR_BLUE,    COLOR_CYAN);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_CYAN), COLOR_MAGENTA, COLOR_CYAN);
        init_pair(makeColorPair(FROB_CYAN,    FROB_CYAN), COLOR_CYAN,    COLOR_CYAN);
        init_pair(makeColorPair(FROB_WHITE,   FROB_CYAN), COLOR_WHITE,   COLOR_CYAN);

        init_pair(makeColorPair(FROB_BLACK,   FROB_WHITE), COLOR_BLACK,   COLOR_WHITE);
        init_pair(makeColorPair(FROB_RED,     FROB_WHITE), COLOR_RED,     COLOR_WHITE);
        init_pair(makeColorPair(FROB_GREEN,   FROB_WHITE), COLOR_GREEN,   COLOR_WHITE);
        init_pair(makeColorPair(FROB_YELLOW,  FROB_WHITE), COLOR_YELLOW,  COLOR_WHITE);
        init_pair(makeColorPair(FROB_BLUE,    FROB_WHITE), COLOR_BLUE,    COLOR_WHITE);
        init_pair(makeColorPair(FROB_MAGENTA, FROB_WHITE), COLOR_MAGENTA, COLOR_WHITE);
        init_pair(makeColorPair(FROB_CYAN,    FROB_WHITE), COLOR_CYAN,    COLOR_WHITE);
        init_pair(makeColorPair(FROB_WHITE,   FROB_WHITE), COLOR_WHITE,   COLOR_WHITE);
    }
}